

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,SingleMethodArg *ptr)

{
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"single arg",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  arrow(this,ptr,ptr->arg);
  (**(ptr->arg->super_Base)._vptr_Base)(ptr->arg,this);
  return;
}

Assistant:

void gv_visitor::visit(SingleMethodArg* ptr) {
    box(ptr, "single arg");
    arrow(ptr, ptr->arg);
    ptr->arg->accept(this);
}